

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
mxx::all2allv<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,mxx *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *msgs,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  undefined8 in_RAX;
  long lVar1;
  pointer ppVar2;
  char *pcVar3;
  int rank;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  lVar1 = 0;
  for (ppVar2 = (msgs->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != (msgs->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar2 = (pointer)&ppVar2->second) {
    lVar1 = lVar1 + *(long *)ppVar2;
  }
  if (*(long *)(this + 8) - *(long *)this >> 4 != lVar1) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_34);
    pcVar3 = 
    "msgs.size() == std::accumulate(send_sizes.begin(), send_sizes.end(), static_cast<size_t>(0))";
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_34,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
           ,0x5ae,"all2allv");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    comm = (comm *)pcVar3;
  }
  all2allv<std::pair<int,double>>
            (__return_storage_ptr__,*(mxx **)this,(pair<int,_double> *)msgs,send_sizes,recv_sizes,
             comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2allv(const std::vector<T>& msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(msgs.size() == std::accumulate(send_sizes.begin(), send_sizes.end(), static_cast<size_t>(0)));
    return all2allv(&msgs[0], send_sizes, recv_sizes, comm);
}